

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

void __thiscall nonblocking_unit_test::main(nonblocking_unit_test *this,string *param_2)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  binder *this_01;
  binder *in_RDI;
  self_ptr p;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  intrusive_ptr<nonblocking_unit_test::binder> local_18 [3];
  
  this_00 = std::operator<<((ostream *)&std::cout,"Running non-blocking test");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  iVar2 = cppcms::application::response();
  uVar3 = 0;
  cppcms::http::response::setbuf(iVar2);
  bVar1 = (bool)cppcms::application::response();
  cppcms::http::response::full_asynchronous_buffering(bVar1);
  calls = calls + 1;
  this_01 = (binder *)operator_new(0x28);
  cppcms::application::release_context();
  binder::binder(this_01,(shared_ptr<cppcms::http::context> *)in_RDI);
  booster::intrusive_ptr<nonblocking_unit_test::binder>::intrusive_ptr
            ((intrusive_ptr<nonblocking_unit_test::binder> *)this_01,in_RDI,
             SUB41((uint)uVar3 >> 0x18,0));
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x110251)
  ;
  booster::intrusive_ptr<nonblocking_unit_test::binder>::operator->(local_18);
  binder::run((binder *)0x11026a);
  booster::intrusive_ptr<nonblocking_unit_test::binder>::~intrusive_ptr
            ((intrusive_ptr<nonblocking_unit_test::binder> *)
             CONCAT44(uVar3,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void main(std::string)
	{
		std::cout << "Running non-blocking test" << std::endl;
		response().setbuf(0);
		response().full_asynchronous_buffering(false);
		calls ++;
		binder::self_ptr p(new binder(release_context()));
		p->run();
	}